

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManSimInfoInit(Gia_ManSim_t *p)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  
  pVVar6 = p->vCis2Ids;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      uVar1 = p->nWords;
      uVar5 = (ulong)uVar1;
      if (pVVar6->pArray[lVar4] < p->pAig->vCis->nSize - p->pAig->nRegs) {
        if (0 < (int)uVar1) {
          puVar2 = p->pDataSimCis;
          uVar5 = uVar5 + 1;
          do {
            uVar3 = Gia_ManRandom(0);
            puVar2[(long)(int)(uVar1 * (int)lVar4) + (uVar5 - 2)] = uVar3;
            uVar5 = uVar5 - 1;
          } while (1 < uVar5);
          pVVar6 = p->vCis2Ids;
        }
      }
      else if (0 < (int)uVar1) {
        memset(p->pDataSimCis + lVar4 * uVar5,0,uVar5 << 2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Gia_ManSimInfoInit( Gia_ManSim_t * p )
{
    int iPioNum, i;
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < Gia_ManPiNum(p->pAig) )
            Gia_ManSimInfoRandom( p, Gia_SimDataCi(p, i) );
        else
            Gia_ManSimInfoZero( p, Gia_SimDataCi(p, i) );
    }
}